

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

void __thiscall
TxConfirmStats::Read(TxConfirmStats *this,AutoFile *filein,int nFileVersion,size_t numBuckets)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  bool bVar4;
  uint uVar5;
  Logger *this_00;
  runtime_error *this_01;
  ulong uVar6;
  vector<double,_std::allocator<double>_> *v;
  vector<double,_std::allocator<double>_> *v_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  double dVar10;
  string_view logging_function;
  string_view source_file;
  size_t maxConfirms;
  size_t numBuckets_local;
  uint64_t obj;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  numBuckets_local = numBuckets;
  AutoFile::read(filein,(int)&obj,&DAT_00000008,numBuckets);
  dVar10 = DecodeDouble(obj);
  this->decay = dVar10;
  if ((dVar10 <= 0.0) || (1.0 <= dVar10)) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"Corrupt estimates file. Decay must be between 0 and 1 (non-inclusive)");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_0027c34b:
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    AutoFile::read(filein,(int)&obj,(void *)0x4,numBuckets);
    this->scale = (uint)obj;
    if ((uint)obj == 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Corrupt estimates file. Scale must be non-zero");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) goto LAB_0027c34b;
    }
    else {
      VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
      Unser<AutoFile,std::vector<double,std::allocator<double>>>
                ((VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *)filein,
                 (AutoFile *)&this->m_feerate_avg,v);
      if ((long)(this->m_feerate_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_feerate_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 == numBuckets_local) {
        VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
        Unser<AutoFile,std::vector<double,std::allocator<double>>>
                  ((VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *)filein,
                   (AutoFile *)&this->txCtAvg,v_00);
        if ((long)(this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 == numBuckets_local) {
          obj = (uint64_t)&this->confAvg;
          AutoFile::operator>>
                    (filein,(Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
                             *)&obj);
          pvVar1 = (this->confAvg).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar2 = (this->confAvg).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar9 = ((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555;
          maxConfirms = this->scale * uVar9;
          if (maxConfirms - 0x3f1 < 0xfffffffffffffc10) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_01,
                       "Corrupt estimates file.  Must maintain estimates for between 1 and 1008 (one week) confirms"
                      );
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) goto LAB_0027c34b;
          }
          else {
            if (pvVar2 != pvVar1) {
              uVar5 = 1;
              uVar7 = 0;
              do {
                if ((long)pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3 != numBuckets_local) {
                  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (this_01,
                             "Corrupt estimates file. Mismatch in feerate conf average bucket count"
                            );
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) goto LAB_0027c34b;
                  goto LAB_0027c4e6;
                }
                uVar7 = (ulong)uVar5;
                uVar5 = uVar5 + 1;
              } while (uVar7 <= uVar9 && uVar9 - uVar7 != 0);
            }
            obj = (uint64_t)&this->failAvg;
            AutoFile::operator>>
                      (filein,(Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
                               *)&obj);
            pvVar3 = (this->failAvg).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((long)pvVar2 - (long)pvVar1 ==
                (long)(this->failAvg).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) {
              if (pvVar2 != pvVar1) {
                uVar7 = 1;
                uVar8 = 0;
                do {
                  uVar6 = uVar7;
                  if ((long)*(pointer *)
                             ((long)&pvVar3[uVar8].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + 8) -
                      *(long *)&pvVar3[uVar8].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data >> 3 != numBuckets_local) {
                    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error
                              (this_01,
                               "Corrupt estimates file. Mismatch in one of failure average bucket counts"
                              );
                    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0027c4e6;
                    goto LAB_0027c34b;
                  }
                  uVar7 = (ulong)((int)uVar6 + 1);
                  uVar8 = uVar6;
                } while (uVar6 <= uVar9 && uVar9 - uVar6 != 0);
              }
              resizeInMemoryCounters(this,numBuckets_local);
              this_00 = LogInstance();
              bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,ESTIMATEFEE,Debug);
              if (bVar4) {
                logging_function._M_str = "Read";
                logging_function._M_len = 4;
                source_file._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                ;
                source_file._M_len = 0x5f;
                LogPrintFormatInternal<unsigned_long,unsigned_long>
                          (logging_function,source_file,0x1d6,ESTIMATEFEE,Debug,
                           (ConstevalFormatString<2U>)0x80659d,&numBuckets_local,&maxConfirms);
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                return;
              }
            }
            else {
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_01,"Corrupt estimates file. Mismatch in confirms tracked for failures"
                        );
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) goto LAB_0027c34b;
            }
          }
        }
        else {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_01,"Corrupt estimates file. Mismatch in tx count bucket count");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) goto LAB_0027c34b;
        }
      }
      else {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_01,"Corrupt estimates file. Mismatch in feerate average bucket count");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) goto LAB_0027c34b;
      }
    }
  }
LAB_0027c4e6:
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::Read(AutoFile& filein, int nFileVersion, size_t numBuckets)
{
    // Read data file and do some very basic sanity checking
    // buckets and bucketMap are not updated yet, so don't access them
    // If there is a read failure, we'll just discard this entire object anyway
    size_t maxConfirms, maxPeriods;

    // The current version will store the decay with each individual TxConfirmStats and also keep a scale factor
    filein >> Using<EncodedDoubleFormatter>(decay);
    if (decay <= 0 || decay >= 1) {
        throw std::runtime_error("Corrupt estimates file. Decay must be between 0 and 1 (non-inclusive)");
    }
    filein >> scale;
    if (scale == 0) {
        throw std::runtime_error("Corrupt estimates file. Scale must be non-zero");
    }

    filein >> Using<VectorFormatter<EncodedDoubleFormatter>>(m_feerate_avg);
    if (m_feerate_avg.size() != numBuckets) {
        throw std::runtime_error("Corrupt estimates file. Mismatch in feerate average bucket count");
    }
    filein >> Using<VectorFormatter<EncodedDoubleFormatter>>(txCtAvg);
    if (txCtAvg.size() != numBuckets) {
        throw std::runtime_error("Corrupt estimates file. Mismatch in tx count bucket count");
    }
    filein >> Using<VectorFormatter<VectorFormatter<EncodedDoubleFormatter>>>(confAvg);
    maxPeriods = confAvg.size();
    maxConfirms = scale * maxPeriods;

    if (maxConfirms <= 0 || maxConfirms > 6 * 24 * 7) { // one week
        throw std::runtime_error("Corrupt estimates file.  Must maintain estimates for between 1 and 1008 (one week) confirms");
    }
    for (unsigned int i = 0; i < maxPeriods; i++) {
        if (confAvg[i].size() != numBuckets) {
            throw std::runtime_error("Corrupt estimates file. Mismatch in feerate conf average bucket count");
        }
    }

    filein >> Using<VectorFormatter<VectorFormatter<EncodedDoubleFormatter>>>(failAvg);
    if (maxPeriods != failAvg.size()) {
        throw std::runtime_error("Corrupt estimates file. Mismatch in confirms tracked for failures");
    }
    for (unsigned int i = 0; i < maxPeriods; i++) {
        if (failAvg[i].size() != numBuckets) {
            throw std::runtime_error("Corrupt estimates file. Mismatch in one of failure average bucket counts");
        }
    }

    // Resize the current block variables which aren't stored in the data file
    // to match the number of confirms and buckets
    resizeInMemoryCounters(numBuckets);

    LogDebug(BCLog::ESTIMATEFEE, "Reading estimates: %u buckets counting confirms up to %u blocks\n",
             numBuckets, maxConfirms);
}